

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O1

void __thiscall TestSuite::doTest(TestSuite *this,string *test_name,test_func *func)

{
  int iVar1;
  long lVar2;
  string *psVar3;
  TestSuite *this_00;
  long *plVar4;
  TestRange<bool> *this_01;
  long *plVar5;
  code *extraout_RDX;
  size_t idx;
  long *plVar6;
  size_t sVar7;
  bool bVar8;
  long *plStack_268;
  long lStack_258;
  long lStack_250;
  long *plStack_248;
  long lStack_240;
  long lStack_238;
  long lStack_230;
  code *pcStack_228;
  string sStack_220;
  undefined1 *apuStack_200 [2];
  undefined1 auStack_1f0 [16];
  stringstream asStack_1e0 [16];
  undefined1 auStack_1d0 [112];
  ios_base aiStack_160 [264];
  string *psStack_58;
  char *pcStack_50;
  
  if (((this->filter)._M_string_length != 0) &&
     (lVar2 = std::__cxx11::string::find((char *)test_name,(ulong)(this->filter)._M_dataplus._M_p,0)
     , lVar2 == -1)) {
    return;
  }
  readyTest(this,test_name);
  psVar3 = getResMsg_abi_cxx11_();
  std::__cxx11::string::_M_replace((ulong)psVar3,0,(char *)psVar3->_M_string_length,0x15eea9);
  this_00 = (TestSuite *)getInfoMsg_abi_cxx11_();
  plVar6 = (long *)0x0;
  this_01 = (TestRange<bool> *)0x15eea9;
  std::__cxx11::string::_M_replace((ulong)this_00,0,(char *)this_00->cntPass,0x15eea9);
  getCurTest()::cur_test = this;
  if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    iVar1 = (*func->_M_invoker)((_Any_data *)func);
    reportTestResult(this,test_name,iVar1);
    return;
  }
  std::__throw_bad_function_call();
  pcStack_50 = "";
  pcStack_228 = extraout_RDX;
  psStack_58 = test_name;
  if (((this_00->filter)._M_string_length != 0) &&
     (lVar2 = std::__cxx11::string::find((char *)plVar6,(ulong)(this_00->filter)._M_dataplus._M_p,0)
     , lVar2 == -1)) {
    return;
  }
  sVar7 = 1;
  if (this_00->useGivenRange == false) {
    sVar7 = TestRange<bool>::getSteps(this_01);
  }
  if (sVar7 != 0) {
    idx = 0;
    do {
      sStack_220._M_dataplus._M_p = (pointer)&sStack_220.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&sStack_220,*plVar6,plVar6[1] + *plVar6);
      std::__cxx11::stringstream::stringstream(asStack_1e0);
      if (this_00->useGivenRange == true) {
        bVar8 = this_00->givenRange != 0;
      }
      else {
        bVar8 = TestRange<bool>::getEntry(this_01,idx);
      }
      std::ostream::_M_insert<bool>(SUB81(auStack_1d0,0));
      std::__cxx11::stringbuf::str();
      plVar4 = (long *)std::__cxx11::string::replace((ulong)apuStack_200,0,(char *)0x0,0x15ec7b);
      plStack_248 = &lStack_238;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        lStack_238 = *plVar5;
        lStack_230 = plVar4[3];
      }
      else {
        lStack_238 = *plVar5;
        plStack_248 = (long *)*plVar4;
      }
      lStack_240 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&plStack_248);
      plStack_268 = &lStack_258;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        lStack_258 = *plVar5;
        lStack_250 = plVar4[3];
      }
      else {
        lStack_258 = *plVar5;
        plStack_268 = (long *)*plVar4;
      }
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&sStack_220,(ulong)plStack_268);
      if (plStack_268 != &lStack_258) {
        operator_delete(plStack_268);
      }
      if (plStack_248 != &lStack_238) {
        operator_delete(plStack_248);
      }
      if (apuStack_200[0] != auStack_1f0) {
        operator_delete(apuStack_200[0]);
      }
      readyTest(this_00,&sStack_220);
      psVar3 = getResMsg_abi_cxx11_();
      std::__cxx11::string::_M_replace((ulong)psVar3,0,(char *)psVar3->_M_string_length,0x15eea9);
      psVar3 = getInfoMsg_abi_cxx11_();
      std::__cxx11::string::_M_replace((ulong)psVar3,0,(char *)psVar3->_M_string_length,0x15eea9);
      getCurTest()::cur_test = this_00;
      iVar1 = (*pcStack_228)(bVar8);
      reportTestResult(this_00,&sStack_220,iVar1);
      std::__cxx11::stringstream::~stringstream(asStack_1e0);
      std::ios_base::~ios_base(aiStack_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_220._M_dataplus._M_p != &sStack_220.field_2) {
        operator_delete(sStack_220._M_dataplus._M_p);
      }
      idx = idx + 1;
    } while (sVar7 != idx);
  }
  return;
}

Assistant:

void doTest( const std::string& test_name,
                 test_func func )
    {
        if (!matchFilter(test_name)) return;

        readyTest(test_name);
        TestSuite::getResMsg() = "";
        TestSuite::getInfoMsg() = "";
        TestSuite::getCurTest() = this;
        int ret = func();
        reportTestResult(test_name, ret);
    }